

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idruptracer.cpp
# Opt level: O0

void __thiscall CaDiCaL::IdrupTracer::IdrupTracer(IdrupTracer *this,Internal *i,File *f,bool b)

{
  bool bVar1;
  byte in_CL;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  uint64_t nonce;
  uint n;
  Random random;
  FileTracer *in_stack_ffffffffffffffa0;
  uint64_t local_40;
  uint local_38;
  Random local_28;
  byte local_19;
  undefined8 local_18;
  undefined8 local_10;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  FileTracer::FileTracer(in_stack_ffffffffffffffa0);
  *in_RDI = &PTR__IdrupTracer_0132a738;
  in_RDI[1] = local_10;
  in_RDI[2] = local_18;
  *(byte *)(in_RDI + 3) = local_19 & 1;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0xda496a);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0xda497d);
  in_RDI[0x11] = 0;
  in_RDI[0x12] = 0;
  in_RDI[0x13] = 0;
  in_RDI[0x14] = 0;
  in_RDI[0x15] = 0;
  Random::Random(&local_28,0x2a);
  for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
    local_40 = Random::next(&local_28);
    if ((local_40 & 1) == 0) {
      local_40 = local_40 + 1;
    }
    in_RDI[(ulong)local_38 + 0xd] = local_40;
  }
  bVar1 = File::piping((File *)nonce);
  *(bool *)((long)in_RDI + 0x19) = bVar1;
  return;
}

Assistant:

IdrupTracer::IdrupTracer (Internal *i, File *f, bool b)
    : internal (i), file (f), binary (b), num_clauses (0), size_clauses (0),
      clauses (0), last_hash (0), last_id (0), last_clause (0)
#ifndef QUIET
      ,
      added (0), deleted (0)
#endif
{
  (void) internal;

  // Initialize random number table for hash function.
  //
  Random random (42);
  for (unsigned n = 0; n < num_nonces; n++) {
    uint64_t nonce = random.next ();
    if (!(nonce & 1))
      nonce++;
    assert (nonce), assert (nonce & 1);
    nonces[n] = nonce;
  }
#ifndef NDEBUG
  binary = b;
#else
  (void) b;
#endif
  piping = file->piping ();
}